

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

uint __thiscall
crnlib::
hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::find_index(hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
             *this,uint *k)

{
  uint uVar1;
  raw_node *prVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  raw_node *prVar6;
  ulong uVar7;
  
  if (this->m_num_valid != 0) {
    uVar1 = *k;
    uVar5 = uVar1 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
    uVar4 = (ulong)uVar5;
    prVar2 = (this->m_values).m_p;
    if (prVar2[uVar4].m_bits[8] != '\0') {
      prVar6 = prVar2 + uVar4;
      if (*(uint *)prVar6->m_bits == uVar1) {
        return uVar5;
      }
      uVar7 = (ulong)((this->m_values).m_size - 1);
      while( true ) {
        iVar3 = (int)uVar4;
        prVar6 = prVar6 + -1;
        uVar4 = (ulong)(iVar3 - 1);
        if (iVar3 == 0) {
          prVar6 = prVar2 + uVar7;
          uVar4 = uVar7;
        }
        if (((uint)uVar4 == uVar5) || (prVar6->m_bits[8] == '\0')) break;
        if (*(uint *)prVar6->m_bits == uVar1) {
          return (uint)uVar4;
        }
      }
    }
  }
  return (this->m_values).m_size;
}

Assistant:

inline uint find_index(const Key& k) const
        {
            if (m_num_valid)
            {
                int index = hash_key(k);
                const node* pNode = &get_node(index);

                if (pNode->state)
                {
                    if (m_equals(pNode->first, k))
                    {
                        return index;
                    }

                    const int orig_index = index;

                    for (;;)
                    {
                        if (!index)
                        {
                            index = m_values.size() - 1;
                            pNode = &get_node(index);
                        }
                        else
                        {
                            index--;
                            pNode--;
                        }

                        if (index == orig_index)
                        {
                            break;
                        }

                        if (!pNode->state)
                        {
                            break;
                        }

                        if (m_equals(pNode->first, k))
                        {
                            return index;
                        }
                    }
                }
            }

            return m_values.size();
        }